

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_duck_schema.cpp
# Opt level: O1

void __thiscall duckdb::ArrowType::SetRunEndEncoded(ArrowType *this)

{
  pointer this_00;
  ArrowStructInfo *pAVar1;
  const_reference this_01;
  type this_02;
  LogicalType actual_type;
  LogicalType local_28;
  
  this_00 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
            operator->(&this->type_info);
  pAVar1 = ArrowTypeInfo::Cast<duckdb::ArrowStructInfo>(this_00);
  this_01 = vector<duckdb::shared_ptr<duckdb::ArrowType,_true>,_true>::operator[]
                      (&pAVar1->children,1);
  this_02 = shared_ptr<duckdb::ArrowType,_true>::operator*(this_01);
  GetDuckType(&local_28,this_02,false);
  if (&this->type != &local_28) {
    (this->type).id_ = local_28.id_;
    (this->type).physical_type_ = local_28.physical_type_;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&(this->type).type_info_,&local_28.type_info_);
  }
  this->run_end_encoded = true;
  LogicalType::~LogicalType(&local_28);
  return;
}

Assistant:

void ArrowType::SetRunEndEncoded() {
	D_ASSERT(type_info);
	D_ASSERT(type_info->type == ArrowTypeInfoType::STRUCT);
	auto &struct_info = type_info->Cast<ArrowStructInfo>();
	D_ASSERT(struct_info.ChildCount() == 2);

	auto actual_type = struct_info.GetChild(1).GetDuckType();
	// Override the duckdb type to the actual type
	type = actual_type;
	run_end_encoded = true;
}